

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

void __thiscall kernel::Context::Context(Context *this)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *in_FS_OFFSET;
  undefined1 local_21;
  undefined1 *local_20;
  long local_18;
  
  local_18 = in_FS_OFFSET[5];
  local_20 = &local_21;
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_20;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar3 = pthread_once(&Context::globals_initialized._M_once,__once_proxy);
  if (iVar3 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      return;
    }
  }
  else if (in_FS_OFFSET[5] == local_18) {
    uVar4 = std::__throw_system_error(iVar3);
    *plVar1 = 0;
    *puVar2 = 0;
    if (in_FS_OFFSET[5] == local_18) {
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

Context::Context()
{
    static std::once_flag globals_initialized{};
    std::call_once(globals_initialized, []() {
        std::string sha256_algo = SHA256AutoDetect();
        LogInfo("Using the '%s' SHA256 implementation\n", sha256_algo);
        RandomInit();
    });
}